

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O1

QDBusArgument * operator<<(QDBusArgument *arg,QVariantMap *map)

{
  QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
  *pQVar1;
  QDBusArgument *this;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  long in_FS_OFFSET;
  QVariant QStack_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginMap
            ((QMetaType)arg,
             (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType);
  pQVar1 = (map->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                 *)0x0) {
    p_Var2 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var2 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  p_Var3 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar1 == (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                 *)0x0) {
    p_Var3 = (_Rb_tree_node_base *)0x0;
  }
  for (; p_Var2 != p_Var3; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    QDBusArgument::beginMapEntry();
    this = (QDBusArgument *)QDBusArgument::operator<<(arg,(QString *)(p_Var2 + 1));
    QVariant::QVariant(&QStack_58,(QVariant *)&p_Var2[1]._M_right);
    QDBusArgument::operator<<(this,(QDBusVariant *)&QStack_58);
    QVariant::~QVariant(&QStack_58);
    QDBusArgument::endMapEntry();
  }
  QDBusArgument::endMap();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return arg;
}

Assistant:

inline QDBusArgument &operator<<(QDBusArgument &arg, const QVariantMap &map)
{
    arg.beginMap(QMetaType::fromType<QString>(), QMetaType::fromType<QDBusVariant>());
    for (const auto &[key, value] : map.asKeyValueRange()) {
        arg.beginMapEntry();
        arg << key << QDBusVariant(value);
        arg.endMapEntry();
    }
    arg.endMap();
    return arg;
}